

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<nonstd::expected_lite::unexpected_type<int>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::expected_lite::unexpected_type<int>const&> *this,
          unexpected_type<int> *rhs)

{
  int iVar1;
  int iVar2;
  lest *this_00;
  unexpected_type<int> *in_R8;
  allocator<char> local_71;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  iVar1 = *(int *)this_00;
  iVar2 = rhs->m_error;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"==",&local_71);
  to_string<nonstd::expected_lite::unexpected_type<int>,nonstd::expected_lite::unexpected_type<int>>
            (&local_70,this_00,(unexpected_type<int> *)local_50,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = iVar1 == iVar2;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result{ lhs == rhs, to_string( lhs, "==", rhs ) }; }